

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

int could_seduce(monst *magr,monst *mdef,attack *mattk)

{
  uint uVar1;
  permonst *ppVar2;
  char cVar3;
  char cVar4;
  int iVar6;
  byte bVar7;
  permonst *ppVar8;
  bool bVar9;
  int iVar5;
  
  ppVar8 = youmonst.data;
  ppVar2 = magr->data;
  iVar6 = 0;
  if ((ppVar2->mflags1 & 0x40000) == 0) {
    if (magr == &youmonst) {
      bVar9 = u.uprops[0xd].blocked == 0 &&
              ((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
              (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0));
      iVar5 = poly_gender();
      cVar3 = (char)iVar5;
    }
    else {
      uVar1 = *(uint *)&magr->field_0x60;
      iVar5 = gender(magr);
      cVar3 = (char)iVar5;
      bVar9 = SUB41((uVar1 & 2) >> 1,0);
      ppVar8 = ppVar2;
    }
    if (mdef == &youmonst) {
      bVar7 = 1;
      if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
        bVar7 = *(byte *)((long)&(youmonst.data)->mflags1 + 3) & 1;
      }
      iVar5 = poly_gender();
      cVar4 = (char)iVar5;
    }
    else {
      bVar7 = *(byte *)((long)&mdef->data->mflags1 + 3) & 1;
      iVar5 = gender(mdef);
      cVar4 = (char)iVar5;
    }
    if (((mattk == (attack *)0x0) || ((bVar9 & bVar7 == 0) == 0)) || (mattk->adtyp == '#')) {
      if (ppVar8->mlet == '\x0e') {
        iVar6 = 2;
      }
      else {
        if (ppVar8 != mons + 0x130 && ppVar8 != mons + 0x12f) {
          return 0;
        }
        iVar6 = 0;
        if ((mattk != (attack *)0x0) && (mattk->adtyp != '#')) {
          return 0;
        }
      }
      if ((int)cVar3 == 1 - cVar4) {
        iVar6 = 1;
      }
    }
  }
  return iVar6;
}

Assistant:

int could_seduce(struct monst *magr, struct monst *mdef, const struct attack *mattk)
/* returns 0 if seduction impossible,
 *	   1 if fine,
 *	   2 if wrong gender for nymph */
{
	const struct permonst *pagr;
	boolean agrinvis, defperc;
	xchar genagr, gendef;

	if (is_animal(magr->data)) return 0;
	if (magr == &youmonst) {
		pagr = youmonst.data;
		agrinvis = (Invis != 0);
		genagr = poly_gender();
	} else {
		pagr = magr->data;
		agrinvis = magr->minvis;
		genagr = gender(magr);
	}
	if (mdef == &youmonst) {
		defperc = (See_invisible != 0);
		gendef = poly_gender();
	} else {
		defperc = perceives(mdef->data);
		gendef = gender(mdef);
	}

	if (agrinvis && !defperc && mattk && mattk->adtyp != AD_SSEX)
		return 0;

	if (pagr->mlet != S_NYMPH
		&& ((pagr != &mons[PM_INCUBUS] && pagr != &mons[PM_SUCCUBUS])
		    || (mattk && mattk->adtyp != AD_SSEX) ))
		return 0;
	
	if (genagr == 1 - gendef)
		return 1;
	else
		return (pagr->mlet == S_NYMPH) ? 2 : 0;
}